

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall flatbuffers::cpp::CppGenerator::GenEnumEquals(CppGenerator *this,EnumDef *enum_def)

{
  CodeWriter *this_00;
  pointer ppEVar1;
  string *text;
  pointer ppEVar2;
  allocator<char> local_329;
  string native_type;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->opts_).super_IDLOptions.gen_compare == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"",(allocator<char> *)&native_type);
    this_00 = &this->code_;
    CodeWriter::operator+=(this_00,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,
               "inline bool operator==(const {{NAME}}Union &lhs, const {{NAME}}Union &rhs) {",
               (allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_190,"  if (lhs.type != rhs.type) return false;",
               (allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"  switch (lhs.type) {",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    ppEVar1 = (enum_def->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppEVar2 = (enum_def->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppEVar2 != ppEVar1;
        ppEVar2 = ppEVar2 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&native_type,"NATIVE_ID",&local_329);
      GetEnumValUse_abi_cxx11_(&local_130,this,enum_def,*ppEVar2);
      CodeWriter::SetValue(this_00,&native_type,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&native_type);
      if ((*ppEVar2)->value == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"    case {{NATIVE_ID}}: {",(allocator<char> *)&native_type);
        CodeWriter::operator+=(this_00,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"      return true;",(allocator<char> *)&native_type);
        CodeWriter::operator+=(this_00,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        text = &local_110;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)text,"    }",(allocator<char> *)&native_type);
        CodeWriter::operator+=(this_00,text);
      }
      else {
        GetUnionElement_abi_cxx11_(&native_type,this,*ppEVar2,true,&(this->opts_).super_IDLOptions);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"NATIVE_TYPE",&local_329);
        CodeWriter::SetValue(this_00,&local_130,&native_type);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"    case {{NATIVE_ID}}: {",(allocator<char> *)&local_130);
        CodeWriter::operator+=(this_00,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,
                   "      return *(reinterpret_cast<const {{NATIVE_TYPE}} *>(lhs.value)) ==",
                   (allocator<char> *)&local_130);
        CodeWriter::operator+=(this_00,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,
                   "             *(reinterpret_cast<const {{NATIVE_TYPE}} *>(rhs.value));",
                   (allocator<char> *)&local_130);
        CodeWriter::operator+=(this_00,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"    }",(allocator<char> *)&local_130);
        CodeWriter::operator+=(this_00,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        text = &native_type;
      }
      std::__cxx11::string::~string((string *)text);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"    default: {",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"      return false;",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"    }",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"  }",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"}",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,
               "inline bool operator!=(const {{NAME}}Union &lhs, const {{NAME}}Union &rhs) {",
               (allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"    return !(lhs == rhs);",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"}",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"",(allocator<char> *)&native_type);
    CodeWriter::operator+=(this_00,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  return;
}

Assistant:

void GenEnumEquals(const EnumDef &enum_def) {
    if (opts_.gen_compare) {
      code_ += "";
      code_ +=
          "inline bool operator==(const {{NAME}}Union &lhs, const "
          "{{NAME}}Union &rhs) {";
      code_ += "  if (lhs.type != rhs.type) return false;";
      code_ += "  switch (lhs.type) {";

      for (const auto &ev : enum_def.Vals()) {
        code_.SetValue("NATIVE_ID", GetEnumValUse(enum_def, *ev));
        if (ev->IsNonZero()) {
          const auto native_type = GetUnionElement(*ev, true, opts_);
          code_.SetValue("NATIVE_TYPE", native_type);
          code_ += "    case {{NATIVE_ID}}: {";
          code_ +=
              "      return *(reinterpret_cast<const {{NATIVE_TYPE}} "
              "*>(lhs.value)) ==";
          code_ +=
              "             *(reinterpret_cast<const {{NATIVE_TYPE}} "
              "*>(rhs.value));";
          code_ += "    }";
        } else {
          code_ += "    case {{NATIVE_ID}}: {";
          code_ += "      return true;";  // "NONE" enum value.
          code_ += "    }";
        }
      }
      code_ += "    default: {";
      code_ += "      return false;";
      code_ += "    }";
      code_ += "  }";
      code_ += "}";

      code_ += "";
      code_ +=
          "inline bool operator!=(const {{NAME}}Union &lhs, const "
          "{{NAME}}Union &rhs) {";
      code_ += "    return !(lhs == rhs);";
      code_ += "}";
      code_ += "";
    }
  }